

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visualizer.cc
# Opt level: O2

Ptr __thiscall
features::Visualizer::draw_matches
          (Visualizer *this,ConstPtr *image1,ConstPtr *image2,Correspondences2D2D *matches)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  element_type *peVar5;
  element_type *peVar6;
  long lVar7;
  int height;
  invalid_argument *this_00;
  size_t sVar8;
  pointer __src;
  ulong uVar9;
  pointer puVar10;
  pointer __dest;
  int iVar11;
  pointer puVar12;
  long lVar13;
  size_t __n;
  undefined1 *puVar14;
  Ptr PVar15;
  
  peVar5 = (image1->super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if (((peVar5->super_TypedImageBase<unsigned_char>).super_ImageBase.c == 3) &&
     (peVar6 = (image2->
               super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr, (peVar6->super_TypedImageBase<unsigned_char>).super_ImageBase.c == 3)) {
    iVar1 = (peVar5->super_TypedImageBase<unsigned_char>).super_ImageBase.w;
    iVar2 = (peVar5->super_TypedImageBase<unsigned_char>).super_ImageBase.h;
    iVar3 = (peVar6->super_TypedImageBase<unsigned_char>).super_ImageBase.w;
    iVar4 = (peVar6->super_TypedImageBase<unsigned_char>).super_ImageBase.h;
    height = iVar4;
    if (iVar4 < iVar2) {
      height = iVar2;
    }
    core::Image<unsigned_char>::create((Image<unsigned_char> *)this,iVar3 + iVar1,height,3);
    puVar10 = *(pointer *)(*(long *)this + 0x18);
    sVar8 = *(long *)(*(long *)this + 0x20) - (long)puVar10;
    __dest = puVar10;
    if (sVar8 != 0) {
      memset(puVar10,0,sVar8);
      puVar10 = *(pointer *)(*(long *)this + 0x20);
      __dest = *(pointer *)(*(long *)this + 0x18);
    }
    puVar12 = (pointer)0x0;
    if (__dest == puVar10) {
      __dest = puVar12;
    }
    peVar5 = (image1->
             super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    puVar10 = (peVar5->super_TypedImageBase<unsigned_char>).data.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (puVar10 ==
        *(pointer *)
         ((long)&(peVar5->super_TypedImageBase<unsigned_char>).data.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data + 8)) {
      puVar10 = puVar12;
    }
    peVar5 = (image2->
             super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    __src = (peVar5->super_TypedImageBase<unsigned_char>).data.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
    if (__src == *(pointer *)
                  ((long)&(peVar5->super_TypedImageBase<unsigned_char>).data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data + 8)) {
      __src = puVar12;
    }
    __n = (size_t)(iVar1 * 3);
    sVar8 = (long)iVar3 * 3;
    if (height < 1) {
      height = 0;
    }
    while (iVar11 = (int)puVar12, height != iVar11) {
      puVar12 = puVar10;
      if ((iVar11 < iVar2) && (puVar12 = puVar10 + __n, iVar1 != 0)) {
        memmove(__dest,puVar10,__n);
      }
      puVar10 = puVar12;
      puVar12 = __src;
      if ((iVar11 < iVar4) && (puVar12 = __src + sVar8, iVar3 != 0)) {
        memmove(__dest + __n,__src,sVar8);
      }
      __src = puVar12;
      __dest = __dest + __n + sVar8;
      puVar12 = (pointer)(ulong)(iVar11 + 1);
    }
    lVar13 = 0x18;
    puVar14 = (anonymous_namespace)::color_table;
    uVar9 = 0;
    while( true ) {
      PVar15.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar9 % 0xc);
      lVar7 = *(long *)matches;
      if ((ulong)(*(long *)(matches + 8) - lVar7 >> 5) <= uVar9) break;
      core::image::draw_line<unsigned_char>
                (*(Image<unsigned_char> **)this,(int)*(double *)(lVar7 + -0x18 + lVar13),
                 (int)*(double *)(lVar7 + -0x10 + lVar13),
                 (int)(*(double *)(lVar7 + -8 + lVar13) + (double)iVar1),
                 (int)*(double *)(lVar7 + lVar13),puVar14 + (uVar9 / 0xc) * -0x24);
      uVar9 = uVar9 + 1;
      lVar13 = lVar13 + 0x20;
      puVar14 = puVar14 + 3;
    }
    PVar15.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Ptr)PVar15.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Only 3-channel images allowed");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

core::ByteImage::Ptr
Visualizer::draw_matches (core::ByteImage::ConstPtr image1,
    core::ByteImage::ConstPtr image2,
    sfm::Correspondences2D2D const& matches)
{
    if (image1->channels() != 3 || image2->channels() != 3)
        throw std::invalid_argument("Only 3-channel images allowed");

    int const img1_width = image1->width();
    int const img1_height = image1->height();
    int const img2_width = image2->width();
    int const img2_height = image2->height();
    int const out_width = img1_width + img2_width;
    int const out_height = std::max(img1_height, img2_height);

    core::ByteImage::Ptr ret = core::ByteImage::create(out_width, out_height, 3);
    ret->fill(0);

    /* Copy images into output image. */
    unsigned char* out_ptr = ret->begin();
    unsigned char const* img1_ptr = image1->begin();
    unsigned char const* img2_ptr = image2->begin();
    for (int y = 0; y < out_height; ++y)
    {
        if (y < img1_height)
        {
            std::copy(img1_ptr, img1_ptr + img1_width * 3, out_ptr);
            img1_ptr += img1_width * 3;
        }
        out_ptr += img1_width * 3;
        if (y < img2_height)
        {
            std::copy(img2_ptr, img2_ptr + img2_width * 3, out_ptr);
            img2_ptr += img2_width * 3;
        }
        out_ptr += img2_width * 3;
    }

    /* Draw matches. */
    for (std::size_t i = 0; i < matches.size(); ++i)
    {
        core::image::draw_line(*ret, matches[i].p1[0], matches[i].p1[1],
            matches[i].p2[0] + img1_width, matches[i].p2[1],
            color_table[i % 12]);
    }

    return ret;
}